

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_referenceExternalSequences(ZSTD_CCtx *cctx,rawSeq *seq,size_t nbSeq)

{
  size_t sStack_8;
  
  if (cctx->stage == ZSTDcs_init) {
    if ((cctx->appliedParams).ldmParams.enableLdm != ZSTD_ps_enable) {
      (cctx->externSeqStore).seq = seq;
      (cctx->externSeqStore).size = nbSeq;
      (cctx->externSeqStore).capacity = nbSeq;
      (cctx->externSeqStore).pos = 0;
      (cctx->externSeqStore).posInSequence = 0;
      return 0;
    }
    sStack_8 = 0xffffffffffffffd8;
  }
  else {
    sStack_8 = 0xffffffffffffffc4;
  }
  return sStack_8;
}

Assistant:

size_t ZSTD_referenceExternalSequences(ZSTD_CCtx* cctx, rawSeq* seq, size_t nbSeq)
{
    RETURN_ERROR_IF(cctx->stage != ZSTDcs_init, stage_wrong,
                    "wrong cctx stage");
    RETURN_ERROR_IF(cctx->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable,
                    parameter_unsupported,
                    "incompatible with ldm");
    cctx->externSeqStore.seq = seq;
    cctx->externSeqStore.size = nbSeq;
    cctx->externSeqStore.capacity = nbSeq;
    cctx->externSeqStore.pos = 0;
    cctx->externSeqStore.posInSequence = 0;
    return 0;
}